

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

InputDeclaration * __thiscall
soul::ModuleCloner::getRemappedInput(ModuleCloner *this,InputDeclaration *old)

{
  mapped_type *this_00;
  InputDeclaration *pIVar1;
  pool_ref<const_soul::heart::InputDeclaration> local_20;
  InputDeclaration *local_18;
  InputDeclaration *old_local;
  ModuleCloner *this_local;
  
  local_18 = old;
  old_local = (InputDeclaration *)this;
  pool_ref<soul::heart::InputDeclaration_const>::pool_ref<soul::heart::InputDeclaration,void>
            ((pool_ref<soul::heart::InputDeclaration_const> *)&local_20,old);
  this_00 = std::
            unordered_map<soul::pool_ref<const_soul::heart::InputDeclaration>,_soul::pool_ptr<soul::heart::InputDeclaration>,_std::hash<soul::pool_ref<const_soul::heart::InputDeclaration>_>,_std::equal_to<soul::pool_ref<const_soul::heart::InputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::InputDeclaration>,_soul::pool_ptr<soul::heart::InputDeclaration>_>_>_>
            ::operator[](&this->inputMappings,(key_type *)&local_20);
  pIVar1 = pool_ptr<soul::heart::InputDeclaration>::operator*(this_00);
  pool_ref<const_soul::heart::InputDeclaration>::~pool_ref(&local_20);
  return pIVar1;
}

Assistant:

heart::InputDeclaration& getRemappedInput (heart::InputDeclaration& old)    { return *inputMappings[old]; }